

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_CallFlowGraph.h
# Opt level: O0

void __thiscall
soul::CallFlowGraph::PreviousCall::findCallSequenceUpTo
          (PreviousCall *this,Function *f,
          vector<soul::pool_ref<soul::heart::Function>,_std::allocator<soul::pool_ref<soul::heart::Function>_>_>
          *sequence)

{
  pool_ref<soul::heart::Function> local_38;
  __normal_iterator<soul::pool_ref<soul::heart::Function>_*,_std::vector<soul::pool_ref<soul::heart::Function>,_std::allocator<soul::pool_ref<soul::heart::Function>_>_>_>
  local_30;
  const_iterator local_28;
  vector<soul::pool_ref<soul::heart::Function>,_std::allocator<soul::pool_ref<soul::heart::Function>_>_>
  *local_20;
  vector<soul::pool_ref<soul::heart::Function>,_std::allocator<soul::pool_ref<soul::heart::Function>_>_>
  *sequence_local;
  Function *f_local;
  PreviousCall *this_local;
  
  local_20 = sequence;
  sequence_local =
       (vector<soul::pool_ref<soul::heart::Function>,_std::allocator<soul::pool_ref<soul::heart::Function>_>_>
        *)f;
  f_local = (Function *)this;
  local_30._M_current =
       (pool_ref<soul::heart::Function> *)
       std::
       vector<soul::pool_ref<soul::heart::Function>,_std::allocator<soul::pool_ref<soul::heart::Function>_>_>
       ::begin(sequence);
  __gnu_cxx::
  __normal_iterator<soul::pool_ref<soul::heart::Function>const*,std::vector<soul::pool_ref<soul::heart::Function>,std::allocator<soul::pool_ref<soul::heart::Function>>>>
  ::__normal_iterator<soul::pool_ref<soul::heart::Function>*>
            ((__normal_iterator<soul::pool_ref<soul::heart::Function>const*,std::vector<soul::pool_ref<soul::heart::Function>,std::allocator<soul::pool_ref<soul::heart::Function>>>>
              *)&local_28,&local_30);
  pool_ref<soul::heart::Function>::pool_ref<soul::heart::Function,void>(&local_38,this->function);
  std::
  vector<soul::pool_ref<soul::heart::Function>,_std::allocator<soul::pool_ref<soul::heart::Function>_>_>
  ::insert(sequence,local_28,&local_38);
  pool_ref<soul::heart::Function>::~pool_ref(&local_38);
  if ((this->previous != (PreviousCall *)0x0) && ((Function *)sequence_local != this->function)) {
    findCallSequenceUpTo(this->previous,(Function *)sequence_local,local_20);
  }
  return;
}

Assistant:

void findCallSequenceUpTo (heart::Function& f, std::vector<pool_ref<heart::Function>>& sequence) const
        {
            sequence.insert (sequence.begin(), function);

            if (previous != nullptr && std::addressof (f) != std::addressof (function))
                previous->findCallSequenceUpTo (f, sequence);
        }